

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O3

void __thiscall adios2::core::engine::BP5Reader::FlushProfiler(BP5Reader *this)

{
  undefined8 *puVar1;
  __pid_t _Var2;
  long *plVar3;
  undefined8 *puVar4;
  size_type *psVar5;
  ulong *puVar6;
  long *plVar7;
  ulong uVar8;
  long lVar9;
  anon_class_16_2_75bba2ca lf_AddMe;
  string LineJSON;
  vector<char,_std::allocator<char>_> profilingJSON;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  transportProfilers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transportTypes;
  string profileFileName;
  string bpBaseName;
  stringstream PIDstr;
  FileFStream profilingJSONStream;
  undefined8 *local_620;
  undefined8 local_618;
  undefined8 local_610;
  undefined8 uStack_608;
  ulong *local_600;
  long local_5f8;
  ulong local_5f0;
  long lStack_5e8;
  ulong *local_5e0;
  long local_5d8;
  ulong local_5d0 [2];
  anon_class_16_2_75bba2ca local_5c0;
  string local_5b0;
  vector<char,_std::allocator<char>_> local_590;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_> local_578;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_560;
  string local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  long *local_508;
  long local_500;
  long local_4f8;
  long lStack_4f0;
  string local_4e8;
  stringstream local_4c8 [16];
  long local_4b8 [3];
  uint auStack_4a0 [22];
  ios_base local_448 [264];
  FileFStream local_340;
  
  transportman::TransportMan::GetTransportsTypes_abi_cxx11_(&local_560,&this->m_DataFileManager);
  transportman::TransportMan::GetTransportsProfilers(&local_578,&this->m_DataFileManager);
  local_5c0.transportTypes = &local_560;
  local_5c0.transportProfilers = &local_578;
  FlushProfiler::anon_class_16_2_75bba2ca::operator()(&local_5c0,&this->m_MDFileManager);
  FlushProfiler::anon_class_16_2_75bba2ca::operator()(&local_5c0,&this->m_MDIndexFileManager);
  FlushProfiler::anon_class_16_2_75bba2ca::operator()(&local_5c0,&this->m_FileMetaMetadataManager);
  if (this->m_Threads != 0) {
    lVar9 = 0;
    uVar8 = 0;
    do {
      FlushProfiler::anon_class_16_2_75bba2ca::operator()
                (&local_5c0,
                 (TransportMan *)
                 ((long)&((this->fileManagers).
                          super__Vector_base<adios2::transportman::TransportMan,_std::allocator<adios2::transportman::TransportMan>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_vptr_TransportMan + lVar9));
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x50;
    } while (uVar8 < this->m_Threads);
  }
  profiling::JSONProfiler::GetRankProfilingJSON
            ((string *)&local_340,&this->m_JSONProfiler,&local_560,&local_578);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_340);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_5b0.field_2._M_allocated_capacity = *psVar5;
    local_5b0.field_2._8_8_ = plVar3[3];
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  }
  else {
    local_5b0.field_2._M_allocated_capacity = *psVar5;
    local_5b0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_5b0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_340.super_Transport._vptr_Transport !=
      (_func_int **)&local_340.super_Transport.m_Type._M_string_length) {
    operator_delete(local_340.super_Transport._vptr_Transport);
  }
  profiling::JSONProfiler::AggregateProfilingJSON(&local_590,&this->m_JSONProfiler,&local_5b0);
  if ((this->super_BP5Engine).m_RankMPI != 0) goto LAB_00471601;
  local_548._M_string_length = 0;
  local_548.field_2._M_local_buf[0] = '\0';
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  transport::FileFStream::FileFStream(&local_340,&(this->super_Engine).m_Comm);
  adios2sys::SystemTools::GetFilenameName(&local_4e8,&(this->super_Engine).m_Name);
  _Var2 = getpid();
  std::__cxx11::stringstream::stringstream(local_4c8);
  *(uint *)((long)auStack_4a0 + *(long *)(local_4b8[0] + -0x18)) =
       *(uint *)((long)auStack_4a0 + *(long *)(local_4b8[0] + -0x18)) & 0xffffffb5 | 8;
  std::ostream::operator<<(local_4b8,_Var2);
  std::operator+(&local_528,"/tmp/",&local_4e8);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_528);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_5f0 = *puVar6;
    lStack_5e8 = plVar3[3];
    local_600 = &local_5f0;
  }
  else {
    local_5f0 = *puVar6;
    local_600 = (ulong *)*plVar3;
  }
  local_5f8 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::stringbuf::str();
  uVar8 = 0xf;
  if (local_600 != &local_5f0) {
    uVar8 = local_5f0;
  }
  if (uVar8 < (ulong)(local_5d8 + local_5f8)) {
    uVar8 = 0xf;
    if (local_5e0 != local_5d0) {
      uVar8 = local_5d0[0];
    }
    if (uVar8 < (ulong)(local_5d8 + local_5f8)) goto LAB_0047141c;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_5e0,0,(char *)0x0,(ulong)local_600);
  }
  else {
LAB_0047141c:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_600,(ulong)local_5e0);
  }
  local_620 = &local_610;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_610 = *puVar1;
    uStack_608 = puVar4[3];
  }
  else {
    local_610 = *puVar1;
    local_620 = (undefined8 *)*puVar4;
  }
  local_618 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_620);
  plVar7 = plVar3 + 2;
  if ((long *)*plVar3 == plVar7) {
    local_4f8 = *plVar7;
    lStack_4f0 = plVar3[3];
    local_508 = &local_4f8;
  }
  else {
    local_4f8 = *plVar7;
    local_508 = (long *)*plVar3;
  }
  local_500 = plVar3[1];
  *plVar3 = (long)plVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_548,(string *)&local_508);
  if (local_508 != &local_4f8) {
    operator_delete(local_508);
  }
  if (local_620 != &local_610) {
    operator_delete(local_620);
  }
  if (local_5e0 != local_5d0) {
    operator_delete(local_5e0);
  }
  if (local_600 != &local_5f0) {
    operator_delete(local_600);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p);
  }
  remove(local_548._M_dataplus._M_p);
  transport::FileFStream::Open(&local_340,&local_548,Write,false,false);
  transport::FileFStream::Write
            (&local_340,
             local_590.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)local_590.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_590.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,0xffffffffffffffff);
  transport::FileFStream::Close(&local_340);
  std::__cxx11::stringstream::~stringstream(local_4c8);
  std::ios_base::~ios_base(local_448);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p);
  }
  transport::FileFStream::~FileFStream(&local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p);
  }
LAB_00471601:
  if (local_590.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_590.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p);
  }
  if (local_578.
      super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_578.
                    super__Vector_base<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_560);
  return;
}

Assistant:

void BP5Reader::FlushProfiler()
{
    auto transportTypes = m_DataFileManager.GetTransportsTypes();
    auto transportProfilers = m_DataFileManager.GetTransportsProfilers();

    auto lf_AddMe = [&](transportman::TransportMan &tm) -> void {
        auto tmpT = tm.GetTransportsTypes();
        auto tmpP = tm.GetTransportsProfilers();

        if (tmpT.size() > 0)
        {
            transportTypes.insert(transportTypes.end(), tmpT.begin(), tmpT.end());
            transportProfilers.insert(transportProfilers.end(), tmpP.begin(), tmpP.end());
        }
    };

    lf_AddMe(m_MDFileManager);
    lf_AddMe(m_MDIndexFileManager);
    lf_AddMe(m_FileMetaMetadataManager);

    for (unsigned int i = 0; i < m_Threads; ++i)
    {
        lf_AddMe(fileManagers[i]);
    }

    const std::string LineJSON(
        m_JSONProfiler.GetRankProfilingJSON(transportTypes, transportProfilers) + ",\n");

    const std::vector<char> profilingJSON(m_JSONProfiler.AggregateProfilingJSON(LineJSON));

    if (m_RankMPI == 0)
    {
        std::string profileFileName;
        transport::FileFStream profilingJSONStream(m_Comm);
        std::string bpBaseName = adios2sys::SystemTools::GetFilenameName(m_Name);

        auto PID = getpid();
        std::stringstream PIDstr;
        PIDstr << std::hex << PID;
        // write profile json in /tmp
        profileFileName = "/tmp/" + bpBaseName + "_" + PIDstr.str() + "_profiling.json";

        try
        {
            (void)remove(profileFileName.c_str());
            profilingJSONStream.Open(profileFileName, Mode::Write);
            profilingJSONStream.Write(profilingJSON.data(), profilingJSON.size());
            profilingJSONStream.Close();
        }
        catch (...)
        { // do nothing
        }
    }
}